

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall
wallet::WalletBatch::WriteKey
          (WalletBatch *this,CPubKey *vchPubKey,CPrivKey *vchPrivKey,CKeyMetadata *keyMeta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchKey;
  uint256 result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  uchar local_158 [32];
  pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  local_100;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  bVar2 = WriteKeyMetadata(this,keyMeta,vchPubKey,false);
  if (bVar2) {
    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar5 = 0x21;
    if ((vchPubKey->vch[0] & 0xfe) != 2) {
      bVar3 = vchPubKey->vch[0] - 4;
      if (bVar3 < 4) {
        lVar5 = *(long *)(&DAT_00833808 + (ulong)bVar3 * 8);
      }
      else {
        lVar5 = 0;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_178,
               (size_type)
               ((vchPrivKey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish +
               (lVar5 - (long)(vchPrivKey->
                              super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start)));
    lVar5 = 0x21;
    if ((vchPubKey->vch[0] & 0xfe) != 2) {
      bVar3 = vchPubKey->vch[0] - 4;
      if (bVar3 < 4) {
        lVar5 = *(long *)(&DAT_00833808 + (ulong)bVar3 * 8);
      }
      else {
        lVar5 = 0;
      }
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,
               local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,vchPubKey,vchPubKey->vch + lVar5);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,
               local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (vchPrivKey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start);
    paVar1 = &local_100.first.field_2;
    local_100.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,DBKeys::KEY_abi_cxx11_,DAT_00b37b18 + DBKeys::KEY_abi_cxx11_);
    memcpy(&local_100.second,vchPubKey,0x41);
    local_158[0x10] = '\0';
    local_158[0x11] = '\0';
    local_158[0x12] = '\0';
    local_158[0x13] = '\0';
    local_158[0x14] = '\0';
    local_158[0x15] = '\0';
    local_158[0x16] = '\0';
    local_158[0x17] = '\0';
    local_158[0x18] = '\0';
    local_158[0x19] = '\0';
    local_158[0x1a] = '\0';
    local_158[0x1b] = '\0';
    local_158[0x1c] = '\0';
    local_158[0x1d] = '\0';
    local_158[0x1e] = '\0';
    local_158[0x1f] = '\0';
    local_158[0] = '\0';
    local_158[1] = '\0';
    local_158[2] = '\0';
    local_158[3] = '\0';
    local_158[4] = '\0';
    local_158[5] = '\0';
    local_158[6] = '\0';
    local_158[7] = '\0';
    local_158[8] = '\0';
    local_158[9] = '\0';
    local_158[10] = '\0';
    local_158[0xb] = '\0';
    local_158[0xc] = '\0';
    local_158[0xd] = '\0';
    local_158[0xe] = '\0';
    local_158[0xf] = '\0';
    local_98.buf[0x30] = '\0';
    local_98.buf[0x31] = '\0';
    local_98.buf[0x32] = '\0';
    local_98.buf[0x33] = '\0';
    local_98.buf[0x34] = '\0';
    local_98.buf[0x35] = '\0';
    local_98.buf[0x36] = '\0';
    local_98.buf[0x37] = '\0';
    local_98.buf[0x38] = '\0';
    local_98.buf[0x39] = '\0';
    local_98.buf[0x3a] = '\0';
    local_98.buf[0x3b] = '\0';
    local_98.buf[0x3c] = '\0';
    local_98.buf[0x3d] = '\0';
    local_98.buf[0x3e] = '\0';
    local_98.buf[0x3f] = '\0';
    local_98.buf[0x20] = '\0';
    local_98.buf[0x21] = '\0';
    local_98.buf[0x22] = '\0';
    local_98.buf[0x23] = '\0';
    local_98.buf[0x24] = '\0';
    local_98.buf[0x25] = '\0';
    local_98.buf[0x26] = '\0';
    local_98.buf[0x27] = '\0';
    local_98.buf[0x28] = '\0';
    local_98.buf[0x29] = '\0';
    local_98.buf[0x2a] = '\0';
    local_98.buf[0x2b] = '\0';
    local_98.buf[0x2c] = '\0';
    local_98.buf[0x2d] = '\0';
    local_98.buf[0x2e] = '\0';
    local_98.buf[0x2f] = '\0';
    local_98.buf[0x10] = '\0';
    local_98.buf[0x11] = '\0';
    local_98.buf[0x12] = '\0';
    local_98.buf[0x13] = '\0';
    local_98.buf[0x14] = '\0';
    local_98.buf[0x15] = '\0';
    local_98.buf[0x16] = '\0';
    local_98.buf[0x17] = '\0';
    local_98.buf[0x18] = '\0';
    local_98.buf[0x19] = '\0';
    local_98.buf[0x1a] = '\0';
    local_98.buf[0x1b] = '\0';
    local_98.buf[0x1c] = '\0';
    local_98.buf[0x1d] = '\0';
    local_98.buf[0x1e] = '\0';
    local_98.buf[0x1f] = '\0';
    local_98.buf[0] = '\0';
    local_98.buf[1] = '\0';
    local_98.buf[2] = '\0';
    local_98.buf[3] = '\0';
    local_98.buf[4] = '\0';
    local_98.buf[5] = '\0';
    local_98.buf[6] = '\0';
    local_98.buf[7] = '\0';
    local_98.buf[8] = '\0';
    local_98.buf[9] = '\0';
    local_98.buf[10] = '\0';
    local_98.buf[0xb] = '\0';
    local_98.buf[0xc] = '\0';
    local_98.buf[0xd] = '\0';
    local_98.buf[0xe] = '\0';
    local_98.buf[0xf] = '\0';
    local_98.s[4] = 0;
    local_98.s[5] = 0;
    local_98.s[6] = 0;
    local_98.s[7] = 0;
    local_98.s[0] = 0;
    local_98.s[1] = 0;
    local_98.s[2] = 0;
    local_98.s[3] = 0;
    local_98.bytes = 0;
    CSHA256::CSHA256(&local_98);
    CSHA256::Write(&local_98,
                   local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    output.m_size = 0x20;
    output.m_data = local_158;
    CHash256::Finalize((CHash256 *)&local_98,output);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
              (&local_138.first,vchPrivKey);
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x10] = local_158[0x10];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x11] = local_158[0x11];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x12] = local_158[0x12];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x13] = local_158[0x13];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x14] = local_158[0x14];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x15] = local_158[0x15];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x16] = local_158[0x16];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x17] = local_158[0x17];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x18] = local_158[0x18];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x19] = local_158[0x19];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1a] = local_158[0x1a];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1b] = local_158[0x1b];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1c] = local_158[0x1c];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1d] = local_158[0x1d];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1e] = local_158[0x1e];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1f] = local_158[0x1f];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0] = local_158[0];
    local_138.second.super_base_blob<256U>.m_data._M_elems[1] = local_158[1];
    local_138.second.super_base_blob<256U>.m_data._M_elems[2] = local_158[2];
    local_138.second.super_base_blob<256U>.m_data._M_elems[3] = local_158[3];
    local_138.second.super_base_blob<256U>.m_data._M_elems[4] = local_158[4];
    local_138.second.super_base_blob<256U>.m_data._M_elems[5] = local_158[5];
    local_138.second.super_base_blob<256U>.m_data._M_elems[6] = local_158[6];
    local_138.second.super_base_blob<256U>.m_data._M_elems[7] = local_158[7];
    local_138.second.super_base_blob<256U>.m_data._M_elems[8] = local_158[8];
    local_138.second.super_base_blob<256U>.m_data._M_elems[9] = local_158[9];
    local_138.second.super_base_blob<256U>.m_data._M_elems[10] = local_158[10];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xb] = local_158[0xb];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xc] = local_158[0xc];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xd] = local_158[0xd];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xe] = local_158[0xe];
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xf] = local_158[0xf];
    bVar4 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                      (this,&local_100,&local_138,false);
    std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_100.first._M_dataplus._M_p,
                      local_100.first.field_2._M_allocated_capacity + 1);
    }
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteKey(const CPubKey& vchPubKey, const CPrivKey& vchPrivKey, const CKeyMetadata& keyMeta)
{
    if (!WriteKeyMetadata(keyMeta, vchPubKey, false)) {
        return false;
    }

    // hash pubkey/privkey to accelerate wallet load
    std::vector<unsigned char> vchKey;
    vchKey.reserve(vchPubKey.size() + vchPrivKey.size());
    vchKey.insert(vchKey.end(), vchPubKey.begin(), vchPubKey.end());
    vchKey.insert(vchKey.end(), vchPrivKey.begin(), vchPrivKey.end());

    return WriteIC(std::make_pair(DBKeys::KEY, vchPubKey), std::make_pair(vchPrivKey, Hash(vchKey)), false);
}